

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus_test.cpp
# Opt level: O0

bool __thiscall crn::corpus_tester::test(corpus_tester *this,char *pCmd_line)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  pointer ppVar5;
  char *pcVar6;
  file_desc_vec *this_00;
  mip_level *pmVar7;
  image_u8 *this_01;
  image_u8 *b_00;
  image_u8 *b_01;
  color_quad<unsigned_char,_int> *pcVar8;
  image<crnlib::color_quad<unsigned_char,_int>_> *piVar9;
  vector<crnlib::image_utils::error_metrics> *local_660;
  vector<crnlib::image_utils::error_metrics> *local_5e8;
  int local_578;
  undefined1 local_498 [8];
  error_metrics em;
  error_metrics em2;
  error_metrics em1;
  uint bx;
  uint by;
  vector<crnlib::image_utils::error_metrics> metrics [2];
  uint num_blocks_y;
  uint num_blocks_x;
  image_u8 *pImg2;
  image_u8 *pImg1;
  image_u8 *pOrig;
  image_u8 img2;
  image_u8 img1;
  image_u8 orig_img;
  uint l;
  image_u8 hybrid_img;
  double time2;
  mipmapped_texture tex2;
  double time1;
  timer t;
  pack_params convert_params;
  mipmapped_texture tex1;
  generate_mipmap_params genmip_params;
  mipmapped_texture orig_tex;
  uint x;
  uint y;
  image_u8 img;
  file_desc *file_desc;
  uint file_index;
  bool perceptual;
  uint num_channels;
  uint first_channel;
  image_u8 b;
  undefined1 local_128 [8];
  image_u8 a;
  undefined1 local_f0 [8];
  image_u8 o;
  file_desc_vec *files;
  find_files file_finder;
  dynamic_string *filespec;
  param_map_const_iterator pStack_90;
  uint in_value_index;
  _Self local_88;
  param_map_const_iterator it;
  double total_time2;
  double total_time1;
  undefined1 local_60 [8];
  command_line_params cmd_line_params;
  char *pCmd_line_local;
  corpus_tester *this_local;
  
  cmd_line_params.m_param_map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pCmd_line;
  crnlib::console::printf("Command line:\n\"%s\"",pCmd_line);
  crnlib::command_line_params::command_line_params((command_line_params *)local_60);
  bVar1 = crnlib::command_line_params::parse
                    ((command_line_params *)local_60,
                     (char *)cmd_line_params.m_param_map._M_t._M_impl.super__Rb_tree_header.
                             _M_node_count,10,test::param_desc_array,true);
  if (bVar1) {
    total_time2 = 0.0;
    it._M_node = (_Base_ptr)0x0;
    local_88._M_node =
         (_Base_ptr)crnlib::command_line_params::begin((command_line_params *)local_60);
    while( true ) {
      pStack_90 = crnlib::command_line_params::end((command_line_params *)local_60);
      bVar1 = std::operator!=(&local_88,&stack0xffffffffffffff70);
      if (!bVar1) break;
      ppVar5 = std::
               _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
               ::operator->(&local_88);
      bVar1 = crnlib::dynamic_string::operator!=(&ppVar5->first,"in");
      if (!bVar1) {
        ppVar5 = std::
                 _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
                 ::operator->(&local_88);
        bVar1 = crnlib::vector<crnlib::dynamic_string>::empty(&(ppVar5->second).m_values);
        if (bVar1) {
          crnlib::console::error("Must follow /in parameter with a filename!\n");
          this_local._7_1_ = 0;
          goto LAB_0010ca10;
        }
        filespec._4_4_ = 0;
        while( true ) {
          ppVar5 = std::
                   _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
                   ::operator->(&local_88);
          uVar3 = crnlib::vector<crnlib::dynamic_string>::size(&(ppVar5->second).m_values);
          if (uVar3 <= filespec._4_4_) break;
          ppVar5 = std::
                   _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
                   ::operator->(&local_88);
          file_finder.m_last_error =
               (int64)crnlib::vector<crnlib::dynamic_string>::operator[]
                                (&(ppVar5->second).m_values,filespec._4_4_);
          crnlib::find_files::find_files((find_files *)&files);
          pcVar6 = crnlib::dynamic_string::get_ptr((dynamic_string *)file_finder.m_last_error);
          bVar1 = crnlib::command_line_params::has_key((command_line_params *)local_60,"deep");
          bVar1 = crnlib::find_files::find((find_files *)&files,pcVar6,bVar1 | 4);
          if (bVar1) {
            this_00 = crnlib::find_files::get_files((find_files *)&files);
            bVar1 = crnlib::vector<crnlib::find_files::file_desc>::empty(this_00);
            if (bVar1) {
              pcVar6 = crnlib::dynamic_string::get_ptr((dynamic_string *)file_finder.m_last_error);
              crnlib::console::warning("No files found: %s",pcVar6);
              this_local._7_1_ = 0;
              total_time1._0_4_ = 1;
            }
            else {
              o.m_pixel_buf._8_8_ = crnlib::find_files::get_files((find_files *)&files);
              crnlib::color_quad<unsigned_char,_int>::make_black();
              crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::image
                        ((image<crnlib::color_quad<unsigned_char,_int>_> *)local_f0,4,4,0xffffffff,
                         (color_quad<unsigned_char,_int> *)&a.m_pixel_buf.m_capacity,0xf);
              crnlib::color_quad<unsigned_char,_int>::make_black();
              crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::image
                        ((image<crnlib::color_quad<unsigned_char,_int>_> *)local_128,4,4,0xffffffff,
                         (color_quad<unsigned_char,_int> *)&b.m_pixel_buf.m_capacity,0xf);
              crnlib::color_quad<unsigned_char,_int>::make_black();
              crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::image
                        ((image<crnlib::color_quad<unsigned_char,_int>_> *)&first_channel,4,4,
                         0xffffffff,(color_quad<unsigned_char,_int> *)&num_channels,0xf);
              file_index = 3;
              bVar1 = crnlib::command_line_params::get_value_as_bool
                                ((command_line_params *)local_60,"perceptual",0,false);
              if (bVar1) {
                file_index = 0;
              }
              crnlib::console::printf("Perceptual mode: %u",(ulong)bVar1);
              for (file_desc._4_4_ = 0;
                  uVar3 = crnlib::vector<crnlib::find_files::file_desc>::size
                                    ((vector<crnlib::find_files::file_desc> *)o.m_pixel_buf._8_8_),
                  file_desc._4_4_ < uVar3; file_desc._4_4_ = file_desc._4_4_ + 1) {
                img.m_pixel_buf._8_8_ =
                     crnlib::vector<crnlib::find_files::file_desc>::operator[]
                               ((vector<crnlib::find_files::file_desc> *)o.m_pixel_buf._8_8_,
                                file_desc._4_4_);
                pcVar6 = crnlib::dynamic_string::get_ptr((dynamic_string *)img.m_pixel_buf._8_8_);
                crnlib::console::printf("-------- Loading image: %s",pcVar6);
                crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::image
                          ((image<crnlib::color_quad<unsigned_char,_int>_> *)&x);
                pcVar6 = crnlib::dynamic_string::get_ptr((dynamic_string *)img.m_pixel_buf._8_8_);
                bVar2 = crnlib::image_utils::read_from_file((image_u8 *)&x,pcVar6,0);
                if (bVar2) {
                  piVar9 = (image<crnlib::color_quad<unsigned_char,_int>_> *)0x22a77d;
                  bVar2 = crnlib::command_line_params::has_key
                                    ((command_line_params *)local_60,"alpha");
                  if (!bVar2) {
                    piVar9 = (image<crnlib::color_quad<unsigned_char,_int>_> *)0x3;
                    bVar2 = crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::
                            is_component_valid((image<crnlib::color_quad<unsigned_char,_int>_> *)&x,
                                               3);
                    if (bVar2) {
                      for (orig_tex.m_last_error.m_pStr._4_4_ = 0;
                          uVar3 = crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::get_height
                                            ((image<crnlib::color_quad<unsigned_char,_int>_> *)&x),
                          orig_tex.m_last_error.m_pStr._4_4_ < uVar3;
                          orig_tex.m_last_error.m_pStr._4_4_ =
                               orig_tex.m_last_error.m_pStr._4_4_ + 1) {
                        for (orig_tex.m_last_error.m_pStr._0_4_ = 0;
                            uVar3 = crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::
                                    get_width((image<crnlib::color_quad<unsigned_char,_int>_> *)&x),
                            (uint)orig_tex.m_last_error.m_pStr < uVar3;
                            orig_tex.m_last_error.m_pStr._0_4_ =
                                 (uint)orig_tex.m_last_error.m_pStr + 1) {
                          pcVar8 = crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::
                                   operator()((image<crnlib::color_quad<unsigned_char,_int>_> *)&x,
                                              (uint)orig_tex.m_last_error.m_pStr,
                                              orig_tex.m_last_error.m_pStr._4_4_);
                          (pcVar8->field_0).field_0.a = 0xff;
                        }
                      }
                      piVar9 = (image<crnlib::color_quad<unsigned_char,_int>_> *)0x3;
                      crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::set_component_valid
                                ((image<crnlib::color_quad<unsigned_char,_int>_> *)&x,3,false);
                    }
                  }
                  crnlib::mipmapped_texture::mipmapped_texture
                            ((mipmapped_texture *)&genmip_params.m_min_mip_size);
                  piVar9 = crnlib::
                           crnlib_new<crnlib::image<crnlib::color_quad<unsigned_char,int>>,crnlib::image<crnlib::color_quad<unsigned_char,int>>>
                                     ((crnlib *)&x,piVar9);
                  crnlib::mipmapped_texture::assign
                            ((mipmapped_texture *)&genmip_params.m_min_mip_size,piVar9,
                             PIXEL_FMT_INVALID,cDefaultOrientationFlags);
                  bVar2 = crnlib::command_line_params::has_key
                                    ((command_line_params *)local_60,"nomips");
                  if (bVar2) {
LAB_0010bd36:
                    crnlib::console::printf("Compress 1");
                    crnlib::mipmapped_texture::mipmapped_texture
                              ((mipmapped_texture *)&convert_params.m_pTask_pool,
                               (mipmapped_texture *)&genmip_params.m_min_mip_size);
                    crnlib::dxt_image::pack_params::pack_params((pack_params *)&t.field_0x10);
                    convert_params.m_compressor._0_1_ =
                         crnlib::command_line_params::get_value_as_bool
                                   ((command_line_params *)local_60,"endpointcaching",0,false);
                    convert_params.m_num_helper_threads = 0;
                    convert_params.m_dxt1a_alpha_threshold = 2;
                    convert_params.m_quality._0_1_ = bVar1;
                    bVar2 = crnlib::command_line_params::get_value_as_bool
                                      ((command_line_params *)local_60,"multithreaded",0,true);
                    if (bVar2) {
                      local_578 = crnlib::g_number_of_processors + -1;
                    }
                    else {
                      local_578 = 0;
                    }
                    t._20_4_ = local_578;
                    convert_params._16_8_ = progress_callback;
                    crnlib::timer::timer((timer *)&time1);
                    crnlib::timer::start((timer *)&time1);
                    bVar2 = crnlib::mipmapped_texture::convert
                                      ((mipmapped_texture *)&convert_params.m_pTask_pool,
                                       PIXEL_FMT_ETC1,false,(pack_params *)&t.field_0x10);
                    if (bVar2) {
                      tex2.m_last_error.m_pStr =
                           (char *)crnlib::timer::get_elapsed_secs((timer *)&time1);
                      total_time2 = total_time2 + (double)tex2.m_last_error.m_pStr;
                      crnlib::console::printf("Elapsed time: %3.3f",tex2.m_last_error.m_pStr);
                      crnlib::console::printf("Compress 2");
                      crnlib::mipmapped_texture::mipmapped_texture
                                ((mipmapped_texture *)&time2,
                                 (mipmapped_texture *)&genmip_params.m_min_mip_size);
                      convert_params.m_compressor._0_1_ = cCRNDXTCompressorCRN;
                      convert_params.m_num_helper_threads = 0;
                      convert_params.m_dxt1a_alpha_threshold = 0;
                      crnlib::timer::start((timer *)&time1);
                      bVar2 = crnlib::mipmapped_texture::convert
                                        ((mipmapped_texture *)&time2,PIXEL_FMT_ETC1,false,
                                         (pack_params *)&t.field_0x10);
                      if (bVar2) {
                        hybrid_img.m_pixel_buf._8_8_ =
                             crnlib::timer::get_elapsed_secs((timer *)&time1);
                        it._M_node = (_Base_ptr)(it._M_node + (double)hybrid_img.m_pixel_buf._8_8_);
                        crnlib::console::printf("Elapsed time: %3.3f",hybrid_img.m_pixel_buf._8_8_);
                        uVar3 = crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::get_width
                                          ((image<crnlib::color_quad<unsigned_char,_int>_> *)&x);
                        uVar4 = crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::get_height
                                          ((image<crnlib::color_quad<unsigned_char,_int>_> *)&x);
                        crnlib::color_quad<unsigned_char,_int>::make_black();
                        crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::image
                                  ((image<crnlib::color_quad<unsigned_char,_int>_> *)&l,uVar3,uVar4,
                                   0xffffffff,
                                   (color_quad<unsigned_char,_int> *)
                                   &orig_img.m_pixel_buf.m_capacity,0xf);
                        for (orig_img.m_pixel_buf.m_size = 0; uVar3 = orig_img.m_pixel_buf.m_size,
                            uVar4 = crnlib::mipmapped_texture::get_num_levels
                                              ((mipmapped_texture *)&genmip_params.m_min_mip_size),
                            uVar3 < uVar4;
                            orig_img.m_pixel_buf.m_size = orig_img.m_pixel_buf.m_size + 1) {
                          crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::image
                                    ((image<crnlib::color_quad<unsigned_char,_int>_> *)
                                     &img1.m_pixel_buf.m_size);
                          crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::image
                                    ((image<crnlib::color_quad<unsigned_char,_int>_> *)
                                     &img2.m_pixel_buf.m_size);
                          crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::image
                                    ((image<crnlib::color_quad<unsigned_char,_int>_> *)&pOrig);
                          pmVar7 = crnlib::mipmapped_texture::get_level
                                             ((mipmapped_texture *)&genmip_params.m_min_mip_size,0,
                                              orig_img.m_pixel_buf.m_size);
                          this_01 = crnlib::mip_level::get_unpacked_image
                                              (pmVar7,(image_u8 *)&img1.m_pixel_buf.m_size,3);
                          pmVar7 = crnlib::mipmapped_texture::get_level
                                             ((mipmapped_texture *)&convert_params.m_pTask_pool,0,
                                              orig_img.m_pixel_buf.m_size);
                          b_00 = crnlib::mip_level::get_unpacked_image
                                           (pmVar7,(image_u8 *)&img2.m_pixel_buf.m_size,3);
                          pmVar7 = crnlib::mipmapped_texture::get_level
                                             ((mipmapped_texture *)&time2,0,
                                              orig_img.m_pixel_buf.m_size);
                          b_01 = crnlib::mip_level::get_unpacked_image(pmVar7,(image_u8 *)&pOrig,3);
                          metrics[1].m_capacity =
                               crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::
                               get_block_width(this_01,4);
                          metrics[1].m_size =
                               crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::
                               get_block_height(this_01,4);
                          local_5e8 = (vector<crnlib::image_utils::error_metrics> *)&bx;
                          do {
                            crnlib::vector<crnlib::image_utils::error_metrics>::vector(local_5e8);
                            local_5e8 = local_5e8 + 1;
                          } while (local_5e8 !=
                                   (vector<crnlib::image_utils::error_metrics> *)&metrics[1].m_size)
                          ;
                          for (em1.mPeakSNR._4_4_ = 0; em1.mPeakSNR._4_4_ < metrics[1].m_size;
                              em1.mPeakSNR._4_4_ = em1.mPeakSNR._4_4_ + 1) {
                            for (em1.mPeakSNR._0_4_ = 0; em1.mPeakSNR._0_4_ < metrics[1].m_capacity;
                                em1.mPeakSNR._0_4_ = em1.mPeakSNR._0_4_ + 1) {
                              pcVar8 = crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::
                                       get_ptr((image<crnlib::color_quad<unsigned_char,_int>_> *)
                                               local_f0);
                              crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::extract_block
                                        (this_01,pcVar8,em1.mPeakSNR._0_4_ << 2,
                                         em1.mPeakSNR._4_4_ << 2,4,4,false);
                              pcVar8 = crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::
                                       get_ptr((image<crnlib::color_quad<unsigned_char,_int>_> *)
                                               local_128);
                              crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::extract_block
                                        (b_00,pcVar8,em1.mPeakSNR._0_4_ << 2,em1.mPeakSNR._4_4_ << 2
                                         ,4,4,false);
                              pcVar8 = crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::
                                       get_ptr((image<crnlib::color_quad<unsigned_char,_int>_> *)
                                               &first_channel);
                              crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::extract_block
                                        (b_01,pcVar8,em1.mPeakSNR._0_4_ << 2,em1.mPeakSNR._4_4_ << 2
                                         ,4,4,false);
                              crnlib::image_utils::error_metrics::error_metrics
                                        ((error_metrics *)&em2.mPeakSNR);
                              crnlib::image_utils::error_metrics::compute
                                        ((error_metrics *)&em2.mPeakSNR,(image_u8 *)local_f0,
                                         (image_u8 *)local_128,0,file_index,true);
                              crnlib::image_utils::error_metrics::error_metrics
                                        ((error_metrics *)&em.mPeakSNR);
                              crnlib::image_utils::error_metrics::compute
                                        ((error_metrics *)&em.mPeakSNR,(image_u8 *)local_f0,
                                         (image_u8 *)&first_channel,0,file_index,true);
                              crnlib::vector<crnlib::image_utils::error_metrics>::push_back
                                        ((vector<crnlib::image_utils::error_metrics> *)&bx,
                                         (error_metrics *)&em2.mPeakSNR);
                              crnlib::vector<crnlib::image_utils::error_metrics>::push_back
                                        ((vector<crnlib::image_utils::error_metrics> *)
                                         &metrics[0].m_size,(error_metrics *)&em.mPeakSNR);
                              if (em2.mRootMeanSquared <= em1.mRootMeanSquared) {
                                crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::blit
                                          ((image<crnlib::color_quad<unsigned_char,_int>_> *)&l,
                                           em1.mPeakSNR._0_4_ << 2,em1.mPeakSNR._4_4_ << 2,
                                           (image<crnlib::color_quad<unsigned_char,_int>_> *)
                                           local_128);
                              }
                              else {
                                add_bad_block(this,(image_u8 *)local_f0);
                                crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::blit
                                          ((image<crnlib::color_quad<unsigned_char,_int>_> *)&l,
                                           em1.mPeakSNR._0_4_ << 2,em1.mPeakSNR._4_4_ << 2,
                                           (image<crnlib::color_quad<unsigned_char,_int>_> *)
                                           &first_channel);
                              }
                            }
                          }
                          bVar2 = crnlib::command_line_params::has_key
                                            ((command_line_params *)local_60,"writehybrid");
                          if (bVar2) {
                            crnlib::image_utils::write_to_file("hybrid.tga",(image_u8 *)&l,1,-1);
                          }
                          crnlib::console::printf
                                    ("---- Mip level: %u, Total blocks: %ux%u, %u",
                                     (ulong)orig_img.m_pixel_buf.m_size,(ulong)metrics[1].m_capacity
                                     ,(ulong)metrics[1].m_size,
                                     (ulong)(metrics[1].m_capacity * metrics[1].m_size));
                          crnlib::console::printf("Compressor 1:");
                          print_metric_stats(this,(vector<crnlib::image_utils::error_metrics> *)&bx,
                                             metrics[1].m_capacity,metrics[1].m_size);
                          crnlib::console::printf("Compressor 2:");
                          print_metric_stats(this,(vector<crnlib::image_utils::error_metrics> *)
                                                  &metrics[0].m_size,metrics[1].m_capacity,
                                             metrics[1].m_size);
                          crnlib::console::printf("Compressor 1 vs. 2:");
                          print_comparative_metric_stats
                                    (this,(command_line_params *)local_60,
                                     (vector<crnlib::image_utils::error_metrics> *)&bx,
                                     (vector<crnlib::image_utils::error_metrics> *)
                                     &metrics[0].m_size,metrics[1].m_capacity,metrics[1].m_size);
                          crnlib::image_utils::error_metrics::error_metrics
                                    ((error_metrics *)local_498);
                          crnlib::image_utils::error_metrics::compute
                                    ((error_metrics *)local_498,this_01,b_00,0,
                                     ((byte)~bVar1 & 1) * 3,true);
                          crnlib::image_utils::error_metrics::print
                                    ((error_metrics *)local_498,"Compressor 1: ");
                          crnlib::image_utils::error_metrics::compute
                                    ((error_metrics *)local_498,this_01,b_01,0,
                                     ((byte)~bVar1 & 1) * 3,true);
                          crnlib::image_utils::error_metrics::print
                                    ((error_metrics *)local_498,"Compressor 2: ");
                          crnlib::image_utils::error_metrics::compute
                                    ((error_metrics *)local_498,this_01,(image_u8 *)&l,0,
                                     ((byte)~bVar1 & 1) * 3,true);
                          crnlib::image_utils::error_metrics::print
                                    ((error_metrics *)local_498,"Best of Both: ");
                          local_660 = (vector<crnlib::image_utils::error_metrics> *)
                                      &metrics[1].m_size;
                          do {
                            local_660 = local_660 + -1;
                            crnlib::vector<crnlib::image_utils::error_metrics>::~vector(local_660);
                          } while (local_660 != (vector<crnlib::image_utils::error_metrics> *)&bx);
                          crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::~image
                                    ((image<crnlib::color_quad<unsigned_char,_int>_> *)&pOrig);
                          crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::~image
                                    ((image<crnlib::color_quad<unsigned_char,_int>_> *)
                                     &img2.m_pixel_buf.m_size);
                          crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::~image
                                    ((image<crnlib::color_quad<unsigned_char,_int>_> *)
                                     &img1.m_pixel_buf.m_size);
                        }
                        crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::~image
                                  ((image<crnlib::color_quad<unsigned_char,_int>_> *)&l);
                        total_time1._0_4_ = 0;
                      }
                      else {
                        crnlib::console::error("Texture conversion failed!");
                        this_local._7_1_ = 0;
                        total_time1._0_4_ = 1;
                      }
                      crnlib::mipmapped_texture::~mipmapped_texture((mipmapped_texture *)&time2);
                    }
                    else {
                      crnlib::console::error("Texture conversion failed!");
                      this_local._7_1_ = 0;
                      total_time1._0_4_ = 1;
                    }
                    crnlib::mipmapped_texture::~mipmapped_texture
                              ((mipmapped_texture *)&convert_params.m_pTask_pool);
                  }
                  else {
                    crnlib::mipmapped_texture::generate_mipmap_params::generate_mipmap_params
                              ((generate_mipmap_params *)&tex1.m_last_error.m_pStr);
                    genmip_params.super_resample_params.m_pFilter._1_1_ = 1;
                    crnlib::console::printf("Generating mipmaps");
                    bVar2 = crnlib::mipmapped_texture::generate_mipmaps
                                      ((mipmapped_texture *)&genmip_params.m_min_mip_size,
                                       (generate_mipmap_params *)&tex1.m_last_error.m_pStr,false);
                    if (bVar2) goto LAB_0010bd36;
                    crnlib::console::error("Mipmap generation failed!");
                    this_local._7_1_ = 0;
                    total_time1._0_4_ = 1;
                  }
                  crnlib::mipmapped_texture::~mipmapped_texture
                            ((mipmapped_texture *)&genmip_params.m_min_mip_size);
                }
                else {
                  pcVar6 = crnlib::dynamic_string::get_ptr((dynamic_string *)img.m_pixel_buf._8_8_);
                  crnlib::console::warning("Failed loading image file: %s",pcVar6);
                  total_time1._0_4_ = 10;
                }
                crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::~image
                          ((image<crnlib::color_quad<unsigned_char,_int>_> *)&x);
                if ((total_time1._0_4_ != 0) && (total_time1._0_4_ != 10)) goto LAB_0010c936;
              }
              total_time1._0_4_ = 0;
LAB_0010c936:
              crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::~image
                        ((image<crnlib::color_quad<unsigned_char,_int>_> *)&first_channel);
              crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::~image
                        ((image<crnlib::color_quad<unsigned_char,_int>_> *)local_128);
              crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::~image
                        ((image<crnlib::color_quad<unsigned_char,_int>_> *)local_f0);
            }
          }
          else {
            pcVar6 = crnlib::dynamic_string::get_ptr((dynamic_string *)file_finder.m_last_error);
            crnlib::console::warning("Failed finding files: %s",pcVar6);
            total_time1._0_4_ = 7;
          }
          crnlib::find_files::~find_files((find_files *)&files);
          if ((total_time1._0_4_ != 0) && (total_time1._0_4_ != 7)) goto LAB_0010ca10;
          filespec._4_4_ = filespec._4_4_ + 1;
        }
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
      ::operator++(&local_88);
    }
    flush_bad_blocks(this);
    crnlib::console::printf("Total times: %4.3f vs. %4.3f",total_time2,it._M_node);
    this_local._7_1_ = 1;
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_0010ca10:
  crnlib::command_line_params::~command_line_params((command_line_params *)local_60);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool corpus_tester::test(const char* pCmd_line)
    {
        console::printf("Command line:\n\"%s\"", pCmd_line);

        static const command_line_params::param_desc param_desc_array[] =
        {
            { "corpus_test", 0, false },
            { "in", 1, true },
            { "deep", 0, false },
            { "alpha", 0, false },
            { "nomips", 0, false },
            { "perceptual", 0, false },
            { "endpointcaching", 0, false },
            { "multithreaded", 0, false },
            { "writehybrid", 0, false },
            { "nobadblocks", 0, false },
        };

        command_line_params cmd_line_params;
        if (!cmd_line_params.parse(pCmd_line, CRNLIB_ARRAY_SIZE(param_desc_array), param_desc_array, true))
        {
            return false;
        }

        double total_time1 = 0, total_time2 = 0;

        command_line_params::param_map_const_iterator it = cmd_line_params.begin();
        for (; it != cmd_line_params.end(); ++it)
        {
            if (it->first != "in")
            {
                continue;
            }
            if (it->second.m_values.empty())
            {
                console::error("Must follow /in parameter with a filename!\n");
                return false;
            }

            for (uint in_value_index = 0; in_value_index < it->second.m_values.size(); in_value_index++)
            {
                const dynamic_string& filespec = it->second.m_values[in_value_index];

                find_files file_finder;
                if (!file_finder.find(filespec.get_ptr(), find_files::cFlagAllowFiles | (cmd_line_params.has_key("deep") ? find_files::cFlagRecursive : 0)))
                {
                    console::warning("Failed finding files: %s", filespec.get_ptr());
                    continue;
                }

                if (file_finder.get_files().empty())
                {
                    console::warning("No files found: %s", filespec.get_ptr());
                    return false;
                }

                const find_files::file_desc_vec& files = file_finder.get_files();

                image_u8 o(4, 4), a(4, 4), b(4, 4);

                uint first_channel = 0;
                uint num_channels = 3;
                bool perceptual = cmd_line_params.get_value_as_bool("perceptual", false);
                if (perceptual)
                {
                    first_channel = 0;
                    num_channels = 0;
                }
                console::printf("Perceptual mode: %u", perceptual);

                for (uint file_index = 0; file_index < files.size(); file_index++)
                {
                    const find_files::file_desc& file_desc = files[file_index];

                    console::printf("-------- Loading image: %s", file_desc.m_fullname.get_ptr());

                    image_u8 img;
                    if (!image_utils::read_from_file(img, file_desc.m_fullname.get_ptr(), 0))
                    {
                        console::warning("Failed loading image file: %s", file_desc.m_fullname.get_ptr());
                        continue;
                    }

                    if ((!cmd_line_params.has_key("alpha")) && img.is_component_valid(3))
                    {
                        for (uint y = 0; y < img.get_height(); y++)
                        {
                            for (uint x = 0; x < img.get_width(); x++)
                            {
                                img(x, y).a = 255;
                            }
                        }

                        img.set_component_valid(3, false);
                    }

                    mipmapped_texture orig_tex;
                    orig_tex.assign(crnlib_new<image_u8>(img));

                    if (!cmd_line_params.has_key("nomips"))
                    {
                        mipmapped_texture::generate_mipmap_params genmip_params;
                        genmip_params.m_srgb = true;

                        console::printf("Generating mipmaps");

                        if (!orig_tex.generate_mipmaps(genmip_params, false))
                        {
                            console::error("Mipmap generation failed!");
                            return false;
                        }
                    }

                    console::printf("Compress 1");

                    mipmapped_texture tex1(orig_tex);
                    dxt_image::pack_params convert_params;
                    convert_params.m_endpoint_caching = cmd_line_params.get_value_as_bool("endpointcaching", 0, false);
                    convert_params.m_compressor = cCRNDXTCompressorCRN;
                    convert_params.m_quality = cCRNDXTQualityNormal;
                    convert_params.m_perceptual = perceptual;
                    convert_params.m_num_helper_threads = cmd_line_params.get_value_as_bool("multithreaded", 0, true) ? (g_number_of_processors - 1) : 0;
                    convert_params.m_pProgress_callback = progress_callback;
                    timer t;
                    t.start();
                    if (!tex1.convert(PIXEL_FMT_ETC1, false, convert_params))
                    {
                        console::error("Texture conversion failed!");
                        return false;
                    }
                    double time1 = t.get_elapsed_secs();
                    total_time1 += time1;
                    console::printf("Elapsed time: %3.3f", time1);

                    console::printf("Compress 2");

                    mipmapped_texture tex2(orig_tex);
                    convert_params.m_endpoint_caching = false;
                    convert_params.m_compressor = cCRNDXTCompressorCRN;
                    convert_params.m_quality = cCRNDXTQualitySuperFast;
                    t.start();
                    if (!tex2.convert(PIXEL_FMT_ETC1, false, convert_params))
                    {
                        console::error("Texture conversion failed!");
                        return false;
                    }
                    double time2 = t.get_elapsed_secs();
                    total_time2 += time2;
                    console::printf("Elapsed time: %3.3f", time2);

                    image_u8 hybrid_img(img.get_width(), img.get_height());

                    for (uint l = 0; l < orig_tex.get_num_levels(); l++)
                    {
                        image_u8 orig_img, img1, img2;

                        image_u8* pOrig = orig_tex.get_level(0, l)->get_unpacked_image(orig_img, cUnpackFlagUncook | cUnpackFlagUnflip);
                        image_u8* pImg1 = tex1.get_level(0, l)->get_unpacked_image(img1, cUnpackFlagUncook | cUnpackFlagUnflip);
                        image_u8* pImg2 = tex2.get_level(0, l)->get_unpacked_image(img2, cUnpackFlagUncook | cUnpackFlagUnflip);

                        const uint num_blocks_x = pOrig->get_block_width(4);
                        const uint num_blocks_y = pOrig->get_block_height(4);

                        crnlib::vector<image_utils::error_metrics> metrics[2];

                        for (uint by = 0; by < num_blocks_y; by++)
                        {
                            for (uint bx = 0; bx < num_blocks_x; bx++)
                            {
                                pOrig->extract_block(o.get_ptr(), bx * 4, by * 4, 4, 4);
                                pImg1->extract_block(a.get_ptr(), bx * 4, by * 4, 4, 4);
                                pImg2->extract_block(b.get_ptr(), bx * 4, by * 4, 4, 4);

                                image_utils::error_metrics em1;
                                em1.compute(o, a, first_channel, num_channels);

                                image_utils::error_metrics em2;
                                em2.compute(o, b, first_channel, num_channels);

                                metrics[0].push_back(em1);
                                metrics[1].push_back(em2);

                                if (em1.mPeakSNR < em2.mPeakSNR)
                                {
                                    add_bad_block(o);

                                    hybrid_img.blit(bx * 4, by * 4, b);
                                }
                                else
                                {
                                    hybrid_img.blit(bx * 4, by * 4, a);
                                }
                            }
                        }

                        if (cmd_line_params.has_key("writehybrid"))
                        {
                            image_utils::write_to_file("hybrid.tga", hybrid_img, image_utils::cWriteFlagIgnoreAlpha);
                        }

                        console::printf("---- Mip level: %u, Total blocks: %ux%u, %u", l, num_blocks_x, num_blocks_y, num_blocks_x * num_blocks_y);

                        console::printf("Compressor 1:");
                        print_metric_stats(metrics[0], num_blocks_x, num_blocks_y);

                        console::printf("Compressor 2:");
                        print_metric_stats(metrics[1], num_blocks_x, num_blocks_y);

                        console::printf("Compressor 1 vs. 2:");
                        print_comparative_metric_stats(cmd_line_params, metrics[0], metrics[1], num_blocks_x, num_blocks_y);

                        image_utils::error_metrics em;

                        em.compute(*pOrig, *pImg1, 0, perceptual ? 0 : 3);
                        em.print("Compressor 1: ");

                        em.compute(*pOrig, *pImg2, 0, perceptual ? 0 : 3);
                        em.print("Compressor 2: ");

                        em.compute(*pOrig, hybrid_img, 0, perceptual ? 0 : 3);
                        em.print("Best of Both: ");
                    }
                }
            } // file_index
        }

        flush_bad_blocks();

        console::printf("Total times: %4.3f vs. %4.3f", total_time1, total_time2);

        return true;
    }